

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void opj_j2k_read_float64_to_int32(void *p_src_data,void *p_dest_data,OPJ_UINT32 p_nb_elem)

{
  double local_40;
  OPJ_FLOAT64 l_temp;
  int *piStack_30;
  OPJ_UINT32 i;
  OPJ_INT32 *l_dest_data;
  OPJ_BYTE *l_src_data;
  void *pvStack_18;
  OPJ_UINT32 p_nb_elem_local;
  void *p_dest_data_local;
  void *p_src_data_local;
  
  piStack_30 = (int *)p_dest_data;
  l_dest_data = (OPJ_INT32 *)p_src_data;
  l_src_data._4_4_ = p_nb_elem;
  pvStack_18 = p_dest_data;
  p_dest_data_local = p_src_data;
  for (l_temp._4_4_ = 0; l_temp._4_4_ < l_src_data._4_4_; l_temp._4_4_ = l_temp._4_4_ + 1) {
    opj_read_double_LE((OPJ_BYTE *)l_dest_data,(OPJ_FLOAT64 *)&local_40);
    l_dest_data = l_dest_data + 2;
    *piStack_30 = (int)local_40;
    piStack_30 = piStack_30 + 1;
  }
  return;
}

Assistant:

static void  opj_j2k_read_float64_to_int32(const void * p_src_data,
        void * p_dest_data, OPJ_UINT32 p_nb_elem)
{
    OPJ_BYTE * l_src_data = (OPJ_BYTE *) p_src_data;
    OPJ_INT32 * l_dest_data = (OPJ_INT32 *) p_dest_data;
    OPJ_UINT32 i;
    OPJ_FLOAT64 l_temp;

    for (i = 0; i < p_nb_elem; ++i) {
        opj_read_double(l_src_data, &l_temp);

        l_src_data += sizeof(OPJ_FLOAT64);

        *(l_dest_data++) = (OPJ_INT32) l_temp;
    }
}